

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O1

CSVError * __thiscall
duckdb::CSVError::IncorrectColumnAmountError
          (CSVError *__return_storage_ptr__,CSVError *this,CSVReaderOptions *options,
          idx_t actual_columns,LinesPerBoundary error_info,string *csv_row,idx_t row_byte_position,
          optional_idx byte_position,string *current_path)

{
  undefined1 *puVar1;
  LinesPerBoundary error_info_p;
  LinesPerBoundary error_info_p_00;
  string *psVar2;
  optional_idx current_path_00;
  ostream *poVar3;
  idx_t iVar4;
  long *plVar5;
  ostringstream how_to_fix_it;
  ostringstream error;
  string local_3f0;
  optional_idx local_3d0;
  optional_idx local_3c8;
  string local_3c0;
  string local_3a0;
  idx_t local_380;
  idx_t iStack_378;
  idx_t local_370;
  idx_t iStack_368;
  string local_360;
  string local_340;
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  plVar5 = (long *)error_info.lines_in_batch;
  ::std::__cxx11::ostringstream::ostringstream(local_1a8);
  ::std::__cxx11::ostringstream::ostringstream(local_320);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"Possible fixes:",0xf);
  local_3f0._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,(char *)&local_3f0,1);
  if ((this->full_error_message).field_2._M_local_buf[1] == '\x01') {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,
               "* Disable the parser\'s strict mode (strict_mode=false) to allow reading rows that do not comply with the CSV standard."
               ,0x76);
    local_3f0._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,(char *)&local_3f0,1);
  }
  if ((char)this[4].row_byte_position == '\0') {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,
               "* Enable null padding (null_padding=true) to replace missing values with NULL",0x4d)
    ;
    local_3f0._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,(char *)&local_3f0,1);
  }
  if (*(char *)((long)&this[1].error_message._M_dataplus._M_p + 1) == '\0') {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"* Enable ignore errors (ignore_errors=true) to skip this row",
               0x3c);
    local_3f0._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,(char *)&local_3f0,1);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Expected Number of Columns: ",0x1c);
  poVar3 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," Found: ",8);
  ::std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  iVar4 = optional_idx::GetIndex((optional_idx *)&row_byte_position);
  if (iVar4 == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = optional_idx::GetIndex((optional_idx *)&row_byte_position);
    iVar4 = iVar4 - 1;
  }
  current_path_00.index = byte_position.index;
  if (options < *(CSVReaderOptions **)((long)&(this->full_error_message).field_2 + 8)) {
    ::std::__cxx11::stringbuf::str();
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_3c0,*plVar5,plVar5[1] + *plVar5);
    local_380 = actual_columns;
    iStack_378 = error_info.boundary_idx;
    optional_idx::optional_idx(&local_3d0,iVar4);
    ::std::__cxx11::stringbuf::str();
    error_info_p.lines_in_batch = iStack_378;
    error_info_p.boundary_idx = local_380;
    CSVError(__return_storage_ptr__,&local_360,TOO_FEW_COLUMNS,(idx_t)options,&local_3c0,
             error_info_p,(idx_t)csv_row,local_3d0,(CSVReaderOptions *)this,&local_3f0,
             (string *)current_path_00.index);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_3f0._M_dataplus._M_p._1_7_,local_3f0._M_dataplus._M_p._0_1_) !=
        &local_3f0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_3f0._M_dataplus._M_p._1_7_,local_3f0._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p);
    }
    psVar2 = &local_360;
  }
  else {
    ::std::__cxx11::stringbuf::str();
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_3a0,*plVar5,plVar5[1] + *plVar5);
    local_370 = actual_columns;
    iStack_368 = error_info.boundary_idx;
    optional_idx::optional_idx(&local_3c8,iVar4);
    ::std::__cxx11::stringbuf::str();
    error_info_p_00.lines_in_batch = iStack_368;
    error_info_p_00.boundary_idx = local_370;
    CSVError(__return_storage_ptr__,&local_340,TOO_MANY_COLUMNS,(idx_t)options,&local_3a0,
             error_info_p_00,(idx_t)csv_row,local_3c8,(CSVReaderOptions *)this,&local_3f0,
             (string *)current_path_00.index);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_3f0._M_dataplus._M_p._1_7_,local_3f0._M_dataplus._M_p._0_1_) !=
        &local_3f0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_3f0._M_dataplus._M_p._1_7_,local_3f0._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p);
    }
    psVar2 = &local_340;
  }
  puVar1 = *(undefined1 **)((psVar2->field_2)._M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1 != &psVar2->field_2) {
    operator_delete(puVar1);
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_320);
  ::std::ios_base::~ios_base(local_2b0);
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

CSVError CSVError::IncorrectColumnAmountError(const CSVReaderOptions &options, idx_t actual_columns,
                                              LinesPerBoundary error_info, string &csv_row, idx_t row_byte_position,
                                              optional_idx byte_position, const string &current_path) {
	std::ostringstream error;
	// We don't have a fix for this
	std::ostringstream how_to_fix_it;
	how_to_fix_it << "Possible fixes:" << '\n';
	if (options.dialect_options.state_machine_options.strict_mode.GetValue()) {
		how_to_fix_it << "* Disable the parser's strict mode (strict_mode=false) to allow reading rows that do not "
		                 "comply with the CSV standard."
		              << '\n';
	}
	if (!options.null_padding) {
		how_to_fix_it << "* Enable null padding (null_padding=true) to replace missing values with NULL" << '\n';
	}
	if (!options.ignore_errors.GetValue()) {
		how_to_fix_it << "* Enable ignore errors (ignore_errors=true) to skip this row" << '\n';
	}
	// How many columns were expected and how many were found
	error << "Expected Number of Columns: " << options.dialect_options.num_cols << " Found: " << actual_columns + 1;
	idx_t byte_pos = byte_position.GetIndex() == 0 ? 0 : byte_position.GetIndex() - 1;
	if (actual_columns >= options.dialect_options.num_cols) {
		return CSVError(error.str(), TOO_MANY_COLUMNS, actual_columns, csv_row, error_info, row_byte_position, byte_pos,
		                options, how_to_fix_it.str(), current_path);
	} else {
		return CSVError(error.str(), TOO_FEW_COLUMNS, actual_columns, csv_row, error_info, row_byte_position, byte_pos,
		                options, how_to_fix_it.str(), current_path);
	}
}